

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_0::VText::VText(VText *this,string *text)

{
  int *piVar1;
  int local_30 [5];
  int local_1c;
  string *local_18;
  string *text_local;
  VText *this_local;
  
  local_18 = text;
  text_local = (string *)this;
  Node::Node(&this->super_Node);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__VText_0014abe8;
  std::__cxx11::string::string((string *)&this->text_,(string *)text);
  local_1c = string_width(&this->text_);
  local_30[0] = 1;
  piVar1 = std::min<int>(&local_1c,local_30);
  this->width_ = *piVar1;
  return;
}

Assistant:

explicit VText(std::string text)
      : text_(std::move(text)), width_{std::min(string_width(text_), 1)} {}